

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined4 uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  __m256i alVar10;
  __m256i alVar11;
  undefined1 auVar12 [28];
  __m256i c;
  __m256i c_00;
  undefined1 auVar13 [32];
  int iVar14;
  parasail_result_t *ppVar15;
  __m256i *ptr;
  __m256i *palVar16;
  __m256i *b;
  __m256i *ptr_00;
  __m256i *b_00;
  __m256i *ptr_01;
  __m256i *b_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  int64_t *ptr_04;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined8 uVar22;
  int iVar23;
  ulong uVar24;
  __m256i *palVar25;
  long lVar26;
  __m256i *palVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  ulong size;
  undefined1 auVar40 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar41 [32];
  undefined1 auVar43 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  __m256i *ptr_05;
  __m256i *local_208;
  undefined1 local_178 [32];
  undefined1 auVar42 [32];
  
  auVar65 = in_ZMM6._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar33 = profile->s1Len;
        if ((int)uVar33 < 1) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar30 = uVar33 - 1;
          size = (ulong)uVar33 + 3 >> 2;
          uVar8 = (ulong)uVar30 % size;
          iVar14 = (int)(uVar30 / size);
          pvVar6 = (profile->profile64).matches;
          pvVar7 = (profile->profile64).similar;
          uVar24 = CONCAT44(0,open);
          iVar37 = -open;
          iVar23 = ppVar5->min;
          uVar19 = 0x8000000000000000 - (long)iVar23;
          if (iVar23 != iVar37 && SBORROW4(iVar23,iVar37) == iVar23 + open < 0) {
            uVar19 = uVar24 | 0x8000000000000000;
          }
          iVar23 = ppVar5->max;
          ppVar15 = parasail_result_new_table3((uint)((ulong)uVar33 + 3) & 0x7ffffffc,s2Len);
          if (ppVar15 != (parasail_result_t *)0x0) {
            ppVar15->flag = ppVar15->flag | 0x4830801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar16 = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            auVar47._8_8_ = 0;
            auVar47._0_8_ = ptr;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = palVar16;
            auVar47 = vpunpcklqdq_avx(auVar47,auVar50);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = b;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = ptr_00;
            auVar50 = vpunpcklqdq_avx(auVar39,auVar44);
            auVar39 = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar47;
            auVar44 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = b_00;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = ptr_01;
            auVar47 = vpunpcklqdq_avx(auVar46,auVar51);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_01;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = ptr_02;
            auVar50 = vpunpcklqdq_avx(auVar52,auVar55);
            auVar47 = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar47;
            auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
            auVar41._0_8_ = -(ulong)(auVar39._0_8_ == 0);
            auVar41._8_8_ = -(ulong)(auVar39._8_8_ == 0);
            auVar41._16_8_ = -(ulong)(auVar44._0_8_ == 0);
            auVar41._24_8_ = -(ulong)(auVar44._8_8_ == 0);
            auVar57._0_8_ = -(ulong)(auVar47._0_8_ == 0);
            auVar57._8_8_ = -(ulong)(auVar47._8_8_ == 0);
            auVar57._16_8_ = -(ulong)(auVar50._0_8_ == 0);
            auVar57._24_8_ = -(ulong)(auVar50._8_8_ == 0);
            auVar41 = vpackssdw_avx2(auVar41,auVar57);
            if (((((b_02 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) && b_03 != (__m256i *)0x0)
                 && b_04 != (__m256i *)0x0) && ptr_04 != (int64_t *)0x0) &&
                ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar41 >> 0x7f,0) == '\0') &&
                   (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar41 >> 0xbf,0) == '\0') &&
                 (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar41[0x1f])) {
              iVar35 = s2Len + -1;
              auVar40._8_4_ = gap;
              auVar40._0_8_ = CONCAT44(0,gap);
              auVar40._12_4_ = 0;
              auVar12._16_4_ = gap;
              auVar12._0_16_ = auVar40;
              auVar12._20_4_ = 0;
              auVar12._24_4_ = gap;
              auVar42._28_4_ = 0;
              auVar42._0_28_ = auVar12;
              lVar38 = uVar19 + 1;
              lVar17 = 0x7ffffffffffffffe - (long)iVar23;
              alVar10[1] = (longlong)ptr_00;
              alVar10[0] = (longlong)b_01;
              alVar10[2] = (longlong)palVar16;
              alVar10[3] = (longlong)ptr_02;
              parasail_memset___m256i(b,alVar10,size);
              alVar11[1] = (longlong)ptr_00;
              alVar11[0] = (longlong)b_01;
              alVar11[2] = (longlong)palVar16;
              alVar11[3] = (longlong)ptr_02;
              parasail_memset___m256i(b_00,alVar11,size);
              alVar1[1] = (longlong)ptr_00;
              alVar1[0] = (longlong)b_01;
              alVar1[2] = (longlong)palVar16;
              alVar1[3] = (longlong)ptr_02;
              parasail_memset___m256i(b_01,alVar1,size);
              alVar2[1] = (longlong)ptr_00;
              alVar2[0] = (longlong)b_01;
              alVar2[2] = (longlong)palVar16;
              alVar2[3] = (longlong)ptr_02;
              parasail_memset___m256i(b_02,alVar2,size);
              c[1] = (longlong)ptr_00;
              c[0] = (longlong)b_01;
              c[2] = (longlong)palVar16;
              c[3] = (longlong)ptr_02;
              parasail_memset___m256i(b_03,c,size);
              c_00[1] = (longlong)ptr_00;
              c_00[0] = (longlong)b_01;
              c_00[2] = (longlong)palVar16;
              c_00[3] = (longlong)ptr_02;
              parasail_memset___m256i(b_04,c_00,size);
              auVar67._8_4_ = open;
              auVar67._0_8_ = uVar24;
              auVar67._12_4_ = 0;
              auVar67._16_4_ = open;
              auVar67._20_4_ = 0;
              auVar67._24_4_ = open;
              auVar67._28_4_ = 0;
              auVar72 = ZEXT3264(auVar67);
              lVar18 = (long)iVar37;
              iVar23 = (int)size;
              auVar53._4_4_ = iVar23;
              auVar53._0_4_ = iVar23;
              auVar53._8_4_ = iVar23;
              auVar53._12_4_ = iVar23;
              auVar53._16_4_ = iVar23;
              auVar53._20_4_ = iVar23;
              auVar53._24_4_ = iVar23;
              auVar53._28_4_ = iVar23;
              auVar43._8_4_ = gap;
              auVar43._0_8_ = CONCAT44(0,gap);
              auVar43._12_4_ = 0;
              auVar43._16_4_ = gap;
              auVar43._20_4_ = 0;
              auVar43._24_4_ = gap;
              auVar43._28_4_ = 0;
              auVar48._8_8_ = lVar18;
              auVar48._0_8_ = lVar18;
              auVar48._16_8_ = lVar18;
              auVar48._24_8_ = lVar18;
              auVar41 = vpmuldq_avx2(auVar53,_DAT_00908b60);
              uVar19 = 0;
              palVar25 = ptr;
              palVar27 = ptr_03;
              do {
                auVar56._8_8_ = uVar19;
                auVar56._0_8_ = uVar19;
                auVar56._16_8_ = uVar19;
                auVar56._24_8_ = uVar19;
                auVar57 = vpaddq_avx2(auVar41,auVar56);
                auVar53 = vpmuludq_avx2(auVar57,auVar43);
                auVar57 = vpsrlq_avx2(auVar57,0x20);
                auVar57 = vpmuludq_avx2(auVar57,auVar43);
                auVar57 = vpsllq_avx2(auVar57,0x20);
                auVar57 = vpaddq_avx2(auVar53,auVar57);
                alVar10 = (__m256i)vpsubq_avx2(auVar48,auVar57);
                alVar11 = (__m256i)vpsubq_avx2((undefined1  [32])alVar10,auVar67);
                *palVar25 = alVar10;
                *palVar27 = alVar11;
                uVar19 = uVar19 + 1;
                palVar27 = palVar27 + 1;
                palVar25 = palVar25 + 1;
              } while (size != uVar19);
              *ptr_04 = 0;
              uVar19 = (ulong)(uint)s2Len;
              lVar18 = uVar19 - 1;
              auVar61._8_8_ = lVar18;
              auVar61._0_8_ = lVar18;
              auVar61._16_8_ = lVar18;
              auVar61._24_8_ = lVar18;
              auVar41 = vpmovsxbq_avx2(ZEXT416(0x4030201));
              uVar20 = 0;
              auVar57 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar59._8_8_ = 0x8000000000000000;
              auVar59._0_8_ = 0x8000000000000000;
              auVar59._16_8_ = 0x8000000000000000;
              auVar59._24_8_ = 0x8000000000000000;
              auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
              auVar64._8_8_ = 4;
              auVar64._0_8_ = 4;
              auVar64._16_8_ = 4;
              auVar64._24_8_ = 4;
              do {
                auVar66._8_8_ = uVar20;
                auVar66._0_8_ = uVar20;
                auVar66._16_8_ = uVar20;
                auVar66._24_8_ = uVar20;
                auVar67 = vpor_avx2(auVar66,auVar57);
                auVar53 = vpcmpgtq_avx2(auVar67 ^ auVar59,auVar61 ^ auVar59);
                auVar67 = vpaddq_avx2(auVar41,auVar65);
                auVar56 = vpmuludq_avx2(auVar67,auVar43);
                auVar67 = vpsrlq_avx2(auVar67,0x20);
                auVar67 = vpmuludq_avx2(auVar67,auVar43);
                auVar67 = vpsllq_avx2(auVar67,0x20);
                auVar67 = vpaddq_avx2(auVar56,auVar67);
                auVar67 = vpsubq_avx2(auVar48,auVar67);
                auVar67 = vpmaskmovq_avx2(auVar53 ^ auVar65,auVar67);
                *(undefined1 (*) [32])(ptr_04 + uVar20 + 1) = auVar67;
                uVar20 = uVar20 + 4;
                auVar41 = vpaddq_avx2(auVar41,auVar64);
              } while ((s2Len + 3U & 0xfffffffc) != uVar20);
              uVar33 = iVar23 - 1;
              lVar28 = size * uVar19;
              lVar18 = lVar28 * 4;
              lVar29 = lVar28 * 8;
              lVar28 = lVar28 * 0xc;
              lVar36 = 0;
              uVar20 = 0;
              auVar68 = ZEXT3264(CONCAT824(lVar38,CONCAT816(lVar38,CONCAT88(lVar38,lVar38))));
              auVar69 = ZEXT3264(CONCAT824(lVar17,CONCAT816(lVar17,CONCAT88(lVar17,lVar17))));
              do {
                palVar25 = ptr;
                local_208 = ptr_01;
                ptr_05 = ptr_02;
                ptr = palVar16;
                palVar27 = ptr_00;
                ptr_02 = b_01;
                ptr_01 = b_00;
                ptr_00 = b;
                local_178 = auVar68._0_32_;
                alVar10 = ptr_00[uVar33];
                alVar11 = ptr_01[uVar33];
                alVar1 = ptr_02[uVar33];
                auVar47 = SUB3216(palVar25[uVar33],0);
                auVar65._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar43._0_16_;
                auVar65._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar47;
                auVar65 = vpalignr_avx2((undefined1  [32])palVar25[uVar33],auVar65,8);
                auVar41 = vperm2i128_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar10,8);
                auVar41 = vpalignr_avx2((undefined1  [32])alVar10,auVar41,8);
                auVar57 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,8);
                auVar57 = vpalignr_avx2((undefined1  [32])alVar11,auVar57,8);
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar43 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,8);
                auVar65 = vpblendd_avx2(auVar65,ZEXT832((ulong)ptr_04[uVar20]),3);
                lVar26 = (long)ppVar5->mapper[(byte)s2[uVar20]] * size * 0x20;
                auVar58 = ZEXT1664((undefined1  [16])0x0);
                lVar31 = 0;
                auVar9._8_8_ = 1;
                auVar9._0_8_ = 1;
                auVar9._16_8_ = 1;
                auVar9._24_8_ = 1;
                auVar60 = ZEXT1664((undefined1  [16])0x0);
                auVar63 = ZEXT3264(CONCAT824(lVar38,CONCAT816(lVar38,CONCAT88(lVar38,lVar38))));
                auVar67 = auVar69._0_32_;
                lVar21 = lVar36;
                do {
                  auVar48 = *(undefined1 (*) [32])((long)*ptr_03 + lVar31);
                  auVar53 = *(undefined1 (*) [32])((long)*b_02 + lVar31);
                  auVar56 = *(undefined1 (*) [32])((long)*b_03 + lVar31);
                  auVar59 = *(undefined1 (*) [32])((long)*b_04 + lVar31);
                  auVar70 = auVar72._0_32_;
                  auVar61 = vpaddq_avx2(auVar65,*(undefined1 (*) [32])
                                                 ((long)pvVar4 + lVar31 + lVar26));
                  auVar65 = vpcmpgtq_avx2(auVar61,auVar48);
                  auVar65 = vblendvpd_avx(auVar48,auVar61,auVar65);
                  auVar54 = auVar63._0_32_;
                  auVar64 = vpcmpgtq_avx2(auVar65,auVar54);
                  auVar65 = vblendvpd_avx(auVar54,auVar65,auVar64);
                  *(undefined1 (*) [32])((long)*ptr + lVar31) = auVar65;
                  auVar71._0_8_ = -(ulong)(auVar65._0_8_ == auVar61._0_8_);
                  auVar71._8_8_ = -(ulong)(auVar65._8_8_ == auVar61._8_8_);
                  auVar71._16_8_ = -(ulong)(auVar65._16_8_ == auVar61._16_8_);
                  auVar71._24_8_ = -(ulong)(auVar65._24_8_ == auVar61._24_8_);
                  auVar61 = vblendvpd_avx(auVar60._0_32_,auVar53,auVar64);
                  auVar41 = vpaddq_avx2(auVar41,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar31 + lVar26));
                  auVar41 = vblendvpd_avx(auVar61,auVar41,auVar71);
                  *(undefined1 (*) [32])((long)*palVar27 + lVar31) = auVar41;
                  auVar61 = vblendvpd_avx(auVar58._0_32_,auVar56,auVar64);
                  auVar57 = vpaddq_avx2(auVar57,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar31 + lVar26));
                  auVar57 = vblendvpd_avx(auVar61,auVar57,auVar71);
                  auVar61 = vblendvpd_avx(auVar9,auVar59,auVar64);
                  auVar64 = vpcmpeqd_avx2(auVar9,auVar9);
                  auVar43 = vpsubq_avx2(auVar43,auVar64);
                  auVar43 = vblendvpd_avx(auVar61,auVar43,auVar71);
                  auVar72 = ZEXT3264(auVar70);
                  *(undefined1 (*) [32])((long)*local_208 + lVar31) = auVar57;
                  *(undefined1 (*) [32])((long)*ptr_05 + lVar31) = auVar43;
                  lVar34 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 8);
                  *(int *)(lVar34 + lVar21) = auVar41._0_4_;
                  lVar34 = lVar34 + lVar21;
                  uVar3 = vextractps_avx(auVar41._0_16_,2);
                  *(undefined4 *)(lVar18 + lVar34) = uVar3;
                  *(int *)(lVar29 + lVar34) = auVar41._16_4_;
                  uVar3 = vextractps_avx(auVar41._16_16_,2);
                  *(undefined4 *)(lVar28 + lVar34) = uVar3;
                  lVar34 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10);
                  *(int *)(lVar34 + lVar21) = auVar57._0_4_;
                  lVar34 = lVar34 + lVar21;
                  uVar3 = vextractps_avx(auVar57._0_16_,2);
                  *(undefined4 *)(lVar18 + lVar34) = uVar3;
                  *(int *)(lVar29 + lVar34) = auVar57._16_4_;
                  uVar3 = vextractps_avx(auVar57._16_16_,2);
                  *(undefined4 *)(lVar28 + lVar34) = uVar3;
                  lVar34 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18);
                  *(int *)(lVar34 + lVar21) = auVar43._0_4_;
                  lVar34 = lVar34 + lVar21;
                  uVar3 = vextractps_avx(auVar43._0_16_,2);
                  *(undefined4 *)(lVar18 + lVar34) = uVar3;
                  *(int *)(lVar29 + lVar34) = auVar43._16_4_;
                  uVar3 = vextractps_avx(auVar43._16_16_,2);
                  *(undefined4 *)(lVar28 + lVar34) = uVar3;
                  lVar34 = *((ppVar15->field_4).trace)->trace_del_table;
                  *(int *)(lVar34 + lVar21) = auVar65._0_4_;
                  lVar34 = lVar34 + lVar21;
                  *(int *)(lVar18 + lVar34) = auVar65._8_4_;
                  *(int *)(lVar29 + lVar34) = auVar65._16_4_;
                  uVar3 = vextractps_avx(auVar65._16_16_,2);
                  *(undefined4 *)(lVar28 + lVar34) = uVar3;
                  auVar61 = vpcmpgtq_avx2(auVar65,auVar67);
                  auVar67 = vblendvpd_avx(auVar65,auVar67,auVar61);
                  auVar61 = vpcmpgtq_avx2(local_178,auVar65);
                  auVar61 = vblendvpd_avx(auVar65,local_178,auVar61);
                  auVar64 = vpcmpgtq_avx2(auVar61,auVar41);
                  auVar61 = vblendvpd_avx(auVar41,auVar61,auVar64);
                  auVar64 = vpcmpgtq_avx2(auVar61,auVar57);
                  auVar61 = vblendvpd_avx(auVar57,auVar61,auVar64);
                  auVar64 = vpcmpgtq_avx2(auVar61,auVar43);
                  local_178 = vblendvpd_avx(auVar43,auVar61,auVar64);
                  auVar66 = vpsubq_avx2(auVar65,auVar70);
                  auVar48 = vpsubq_avx2(auVar48,auVar42);
                  auVar64 = vpcmpgtq_avx2(auVar66,auVar48);
                  auVar48 = vblendvpd_avx(auVar48,auVar66,auVar64);
                  auVar53 = vblendvpd_avx(auVar53,auVar41,auVar64);
                  auVar56 = vblendvpd_avx(auVar56,auVar57,auVar64);
                  auVar61 = vpcmpeqd_avx2(auVar65,auVar65);
                  auVar65 = vpsubq_avx2(auVar59,auVar61);
                  auVar59 = vpsubq_avx2(auVar43,auVar61);
                  auVar65 = vblendvpd_avx(auVar65,auVar59,auVar64);
                  *(undefined1 (*) [32])((long)*ptr_03 + lVar31) = auVar48;
                  *(undefined1 (*) [32])((long)*b_02 + lVar31) = auVar53;
                  *(undefined1 (*) [32])((long)*b_03 + lVar31) = auVar56;
                  *(undefined1 (*) [32])((long)*b_04 + lVar31) = auVar65;
                  auVar65 = vpsubq_avx2(auVar54,auVar42);
                  auVar43 = vpcmpgtq_avx2(auVar66,auVar65);
                  auVar65 = vblendvpd_avx(auVar65,auVar66,auVar43);
                  auVar63 = ZEXT3264(auVar65);
                  auVar65 = vblendvpd_avx(auVar60._0_32_,auVar41,auVar43);
                  auVar60 = ZEXT3264(auVar65);
                  auVar65 = vblendvpd_avx(auVar58._0_32_,auVar57,auVar43);
                  auVar58 = ZEXT3264(auVar65);
                  auVar65 = vpsubq_avx2(auVar9,auVar61);
                  auVar9 = vblendvpd_avx(auVar65,auVar59,auVar43);
                  auVar65 = *(undefined1 (*) [32])((long)*palVar25 + lVar31);
                  auVar41 = *(undefined1 (*) [32])((long)*ptr_00 + lVar31);
                  auVar57 = *(undefined1 (*) [32])((long)*ptr_01 + lVar31);
                  auVar43 = *(undefined1 (*) [32])((long)*ptr_02 + lVar31);
                  lVar31 = lVar31 + 0x20;
                  lVar21 = lVar21 + uVar19 * 4;
                } while (size << 5 != lVar31);
                iVar23 = 0;
                auVar69 = ZEXT3264(auVar67);
                auVar68 = ZEXT3264(local_178);
                auVar65 = vpcmpeqd_avx2(auVar43,auVar43);
                auVar62 = ZEXT3264(auVar9);
                do {
                  auVar47 = SUB3216(palVar25[uVar33],0);
                  auVar54._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar40;
                  auVar45._12_4_ = 0;
                  auVar45._0_12_ = auVar12._16_12_;
                  auVar54._16_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar47;
                  auVar57 = vpalignr_avx2((undefined1  [32])palVar25[uVar33],auVar54,8);
                  auVar43 = vpermpd_avx2(auVar63._0_32_,0x90);
                  auVar67 = auVar60._0_32_;
                  auVar41 = vperm2f128_avx(auVar67,auVar67,8);
                  auVar41 = vpalignr_avx2(auVar67,auVar41,8);
                  auVar60 = ZEXT3264(auVar41);
                  auVar67 = auVar58._0_32_;
                  auVar41 = vperm2f128_avx(auVar67,auVar67,8);
                  auVar41 = vpalignr_avx2(auVar67,auVar41,8);
                  auVar58 = ZEXT3264(auVar41);
                  auVar67 = vpermpd_avx2(auVar62._0_32_,0x90);
                  auVar41 = vpblendd_avx2(auVar57,ZEXT832((ulong)ptr_04[uVar20]),3);
                  auVar57 = vblendpd_avx(auVar43,ZEXT832(ptr_04[uVar20 + 1] - uVar24),1);
                  auVar63 = ZEXT3264(auVar57);
                  auVar57 = vblendpd_avx(auVar67,SUB6432(ZEXT864(1),0),1);
                  auVar62 = ZEXT3264(auVar57);
                  lVar31 = 0;
                  lVar21 = lVar36;
                  do {
                    auVar57 = vpaddq_avx2(auVar41,*(undefined1 (*) [32])
                                                   ((long)pvVar4 + lVar31 + lVar26));
                    auVar41 = *(undefined1 (*) [32])((long)*ptr + lVar31);
                    auVar59 = auVar63._0_32_;
                    auVar43 = vpcmpgtq_avx2(auVar41,auVar59);
                    auVar41 = vblendvpd_avx(auVar59,auVar41,auVar43);
                    *(undefined1 (*) [32])((long)*ptr + lVar31) = auVar41;
                    auVar49._0_8_ = -(ulong)(auVar41._0_8_ == auVar57._0_8_);
                    auVar49._8_8_ = -(ulong)(auVar41._8_8_ == auVar57._8_8_);
                    auVar49._16_8_ = -(ulong)(auVar41._16_8_ == auVar57._16_8_);
                    auVar49._24_8_ = -(ulong)(auVar41._24_8_ == auVar57._24_8_);
                    auVar67 = vpor_avx2(auVar49,auVar43);
                    auVar57 = vblendvpd_avx(auVar60._0_32_,
                                            *(undefined1 (*) [32])((long)*palVar27 + lVar31),auVar67
                                           );
                    *(undefined1 (*) [32])((long)*palVar27 + lVar31) = auVar57;
                    auVar43 = vblendvpd_avx(auVar58._0_32_,
                                            *(undefined1 (*) [32])((long)*local_208 + lVar31),
                                            auVar67);
                    *(undefined1 (*) [32])((long)*local_208 + lVar31) = auVar43;
                    auVar67 = vblendvpd_avx(auVar62._0_32_,
                                            *(undefined1 (*) [32])((long)*ptr_05 + lVar31),auVar67);
                    *(undefined1 (*) [32])((long)*ptr_05 + lVar31) = auVar67;
                    auVar48 = vpcmpgtq_avx2(auVar41,auVar69._0_32_);
                    auVar48 = vblendvpd_avx(auVar41,auVar69._0_32_,auVar48);
                    auVar69 = ZEXT3264(auVar48);
                    auVar53 = vpcmpgtq_avx2(auVar68._0_32_,auVar41);
                    auVar53 = vblendvpd_avx(auVar41,auVar68._0_32_,auVar53);
                    auVar56 = vpcmpgtq_avx2(auVar53,auVar57);
                    auVar53 = vblendvpd_avx(auVar57,auVar53,auVar56);
                    auVar56 = vpcmpgtq_avx2(auVar53,auVar43);
                    auVar53 = vblendvpd_avx(auVar43,auVar53,auVar56);
                    auVar56 = vpcmpgtq_avx2(auVar53,auVar67);
                    auVar53 = vblendvpd_avx(auVar67,auVar53,auVar56);
                    auVar68 = ZEXT3264(auVar53);
                    lVar34 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar34 + lVar21) = auVar57._0_4_;
                    lVar34 = lVar34 + lVar21;
                    *(int *)(lVar18 + lVar34) = auVar57._8_4_;
                    *(int *)(lVar29 + lVar34) = auVar57._16_4_;
                    uVar3 = vextractps_avx(auVar57._16_16_,2);
                    *(undefined4 *)(lVar28 + lVar34) = uVar3;
                    lVar34 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar34 + lVar21) = auVar43._0_4_;
                    lVar34 = lVar34 + lVar21;
                    *(int *)(lVar18 + lVar34) = auVar43._8_4_;
                    *(int *)(lVar29 + lVar34) = auVar43._16_4_;
                    uVar3 = vextractps_avx(auVar43._16_16_,2);
                    *(undefined4 *)(lVar28 + lVar34) = uVar3;
                    lVar34 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar34 + lVar21) = auVar67._0_4_;
                    lVar34 = lVar34 + lVar21;
                    *(int *)(lVar18 + lVar34) = auVar67._8_4_;
                    *(int *)(lVar29 + lVar34) = auVar67._16_4_;
                    uVar3 = vextractps_avx(auVar67._16_16_,2);
                    *(undefined4 *)(lVar28 + lVar34) = uVar3;
                    lVar34 = *((ppVar15->field_4).trace)->trace_del_table;
                    *(int *)(lVar34 + lVar21) = auVar41._0_4_;
                    lVar34 = lVar34 + lVar21;
                    *(int *)(lVar18 + lVar34) = auVar41._8_4_;
                    *(int *)(lVar29 + lVar34) = auVar41._16_4_;
                    uVar3 = vextractps_avx(auVar41._16_16_,2);
                    *(undefined4 *)(lVar28 + lVar34) = uVar3;
                    auVar41 = vpsubq_avx2(auVar41,auVar70);
                    auVar56 = vpsubq_avx2(auVar59,auVar42);
                    auVar63 = ZEXT3264(auVar56);
                    auVar56 = vpcmpgtq_avx2(auVar41,auVar56);
                    auVar41 = auVar65 & ~auVar56;
                    if ((((auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar41 >> 0x7f,0) == '\0') && SUB321(auVar41 >> 0xbf,0) == '\0') &&
                        -1 < auVar41[0x1f]) goto LAB_007f09c9;
                    auVar41 = vblendvpd_avx(auVar60._0_32_,auVar57,auVar56);
                    auVar60 = ZEXT3264(auVar41);
                    auVar41 = vblendvpd_avx(auVar58._0_32_,auVar43,auVar56);
                    auVar58 = ZEXT3264(auVar41);
                    auVar41 = vblendvpd_avx(auVar62._0_32_,auVar67,auVar56);
                    auVar41 = vpsubq_avx2(auVar41,auVar65);
                    auVar62 = ZEXT3264(auVar41);
                    auVar41 = *(undefined1 (*) [32])((long)*palVar25 + lVar31);
                    lVar31 = lVar31 + 0x20;
                    lVar21 = lVar21 + uVar19 * 4;
                  } while (size << 5 != lVar31);
                  iVar23 = iVar23 + 1;
                } while (iVar23 != 4);
LAB_007f09c9:
                uVar20 = uVar20 + 1;
                lVar36 = lVar36 + 4;
                b = palVar27;
                b_00 = local_208;
                b_01 = ptr_05;
                auVar43 = auVar42;
                palVar16 = palVar25;
                if (uVar20 == uVar19) {
                  alVar10 = ptr[uVar8];
                  auVar47 = alVar10._16_16_;
                  alVar11 = palVar27[uVar8];
                  auVar50 = alVar11._16_16_;
                  alVar1 = local_208[uVar8];
                  auVar39 = alVar1._16_16_;
                  alVar2 = ptr_05[uVar8];
                  auVar44 = alVar2._16_16_;
                  if (iVar14 < 3) {
                    iVar23 = 0;
                    do {
                      auVar65 = vperm2i128_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar10,
                                                8);
                      alVar10 = (__m256i)vpalignr_avx2((undefined1  [32])alVar10,auVar65,8);
                      auVar47 = alVar10._16_16_;
                      auVar65 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,
                                                8);
                      alVar11 = (__m256i)vpalignr_avx2((undefined1  [32])alVar11,auVar65,8);
                      auVar50 = alVar11._16_16_;
                      auVar65 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8)
                      ;
                      alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar65,8);
                      auVar39 = alVar1._16_16_;
                      auVar65 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8)
                      ;
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar65,8);
                      auVar44 = alVar2._16_16_;
                      iVar23 = iVar23 + 1;
                    } while (iVar23 < 3 - iVar14);
                  }
                  auVar70._8_8_ = lVar38;
                  auVar70._0_8_ = lVar38;
                  auVar70._16_8_ = lVar38;
                  auVar70._24_8_ = lVar38;
                  auVar65 = vpcmpgtq_avx2(auVar70,auVar48);
                  auVar13._8_8_ = lVar17;
                  auVar13._0_8_ = lVar17;
                  auVar13._16_8_ = lVar17;
                  auVar13._24_8_ = lVar17;
                  auVar41 = vpcmpgtq_avx2(auVar53,auVar13);
                  auVar65 = vpor_avx2(auVar41,auVar65);
                  if ((((auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       SUB321(auVar65 >> 0x7f,0) == '\0') && SUB321(auVar65 >> 0xbf,0) == '\0') &&
                      -1 < auVar65[0x1f]) {
                    uVar22 = vpextrq_avx(auVar47,1);
                    iVar23 = (int)uVar22;
                    uVar22 = vpextrq_avx(auVar50,1);
                    iVar14 = (int)uVar22;
                    uVar22 = vpextrq_avx(auVar39,1);
                    iVar37 = (int)uVar22;
                    uVar22 = vpextrq_avx(auVar44,1);
                    iVar32 = (int)uVar22;
                  }
                  else {
                    *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                    iVar23 = 0;
                    iVar14 = 0;
                    iVar37 = 0;
                    iVar32 = 0;
                    iVar35 = 0;
                    uVar30 = 0;
                  }
                  ppVar15->score = iVar23;
                  ppVar15->end_query = uVar30;
                  ppVar15->end_ref = iVar35;
                  ((ppVar15->field_4).stats)->matches = iVar14;
                  ((ppVar15->field_4).stats)->similar = iVar37;
                  ((ppVar15->field_4).stats)->length = iVar32;
                  parasail_free(ptr_04);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_05);
                  parasail_free(ptr_01);
                  parasail_free(local_208);
                  parasail_free(ptr_00);
                  parasail_free(palVar27);
                  parasail_free(palVar25);
                  parasail_free(ptr);
                  return ppVar15;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl (vH, 8);
                vHM = _mm256_slli_si256_rpl (vHM, 8);
                vHS = _mm256_slli_si256_rpl (vHS, 8);
                vHL = _mm256_slli_si256_rpl (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
            vHM = _mm256_slli_si256_rpl (vHM, 8);
            vHS = _mm256_slli_si256_rpl (vHS, 8);
            vHL = _mm256_slli_si256_rpl (vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}